

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

QString * __thiscall Parser::resolveInclude(Parser *this,QString *filename)

{
  bool bVar1;
  QStringBuilder<const_QString_&,_QLatin1Char> *a;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QLatin1Char> QVar2;
  QString *sp;
  add_const_t<QList<QString>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QFileInfo info;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&>
  *in_stack_ffffffffffffff18;
  QList<QString> *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff28;
  QString *a_00;
  QString *this_00;
  QFileInfo *in_stack_ffffffffffffff48;
  QStringBuilder<const_QString_&,_QLatin1Char> *this_01;
  QString local_71;
  QString *local_50;
  const_iterator local_48;
  const_iterator local_40;
  undefined8 local_38;
  QString *local_30;
  char local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QFileInfo::QFileInfo((QFileInfo *)in_RDI,in_stack_ffffffffffffff28);
  bVar1 = QFileInfo::exists(in_stack_ffffffffffffff48);
  if (bVar1) {
    QFileInfo::absoluteFilePath((QFileInfo *)this_00);
  }
  else {
    local_40.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_40 = QList<QString>::begin(in_stack_ffffffffffffff20);
    local_48.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_48 = QList<QString>::end(in_stack_ffffffffffffff20);
    while( true ) {
      local_50 = local_48.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_40,local_48);
      if (!bVar1) break;
      a = (QStringBuilder<const_QString_&,_QLatin1Char> *)
          QList<QString>::const_iterator::operator*(&local_40);
      a_00 = &local_71;
      this_01 = a;
      QLatin1Char::QLatin1Char((QLatin1Char *)a_00,'/');
      QVar2 = ::operator+(a_00,(QLatin1Char *)a);
      local_30 = QVar2.a;
      local_28 = (char)QVar2.b.ch;
      ::operator+(a,(QString *)in_stack_ffffffffffffff18);
      QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff18);
      QFileInfo::QFileInfo((QFileInfo *)in_RDI,a_00);
      QFileInfo::operator=((QFileInfo *)a,(QFileInfo *)in_stack_ffffffffffffff18);
      QFileInfo::~QFileInfo((QFileInfo *)0x10f853);
      QString::~QString((QString *)0x10f85d);
      bVar1 = QFileInfo::exists((QFileInfo *)this_01);
      if (bVar1) {
        QFileInfo::absoluteFilePath((QFileInfo *)this_00);
        goto LAB_0010f8b2;
      }
      QList<QString>::const_iterator::operator++(&local_40);
    }
    QString::QString((QString *)0x10f8aa);
  }
LAB_0010f8b2:
  QFileInfo::~QFileInfo((QFileInfo *)0x10f8bf);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString Parser::resolveInclude(const QString &filename)
{
    QFileInfo info(filename);
    if (info.exists())
        return info.absoluteFilePath();
    for (const QString &sp : std::as_const(m_includeDirs)) {
        info = QFileInfo(sp + QLatin1Char('/') + filename);
        if (info.exists())
            return info.absoluteFilePath();
    }
    return {};
}